

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_enc.c
# Opt level: O0

WebPEncodingError PutAlphaChunk(VP8Encoder *enc)

{
  long lVar1;
  int iVar2;
  long in_RDI;
  uint8_t alpha_chunk_hdr [8];
  WebPPicture *pic;
  uint32_t in_stack_ffffffffffffffdc;
  WebPPicture *pic_00;
  WebPEncodingError local_4;
  
  lVar1 = *(long *)(in_RDI + 8);
  pic_00 = (WebPPicture *)0x48504c41;
  PutLE32((uint8_t *)0x48504c41,in_stack_ffffffffffffffdc);
  iVar2 = (**(code **)(lVar1 + 0x60))(&stack0xffffffffffffffe0,8,lVar1);
  if (iVar2 == 0) {
    local_4 = VP8_ENC_ERROR_BAD_WRITE;
  }
  else {
    iVar2 = (**(code **)(lVar1 + 0x60))
                      (*(undefined8 *)(in_RDI + 0x220),*(undefined4 *)(in_RDI + 0x228),lVar1);
    if (iVar2 == 0) {
      local_4 = VP8_ENC_ERROR_BAD_WRITE;
    }
    else {
      if (((*(uint *)(in_RDI + 0x228) & 1) != 0) && (iVar2 = PutPaddingByte(pic_00), iVar2 == 0)) {
        return VP8_ENC_ERROR_BAD_WRITE;
      }
      local_4 = VP8_ENC_OK;
    }
  }
  return local_4;
}

Assistant:

static WebPEncodingError PutAlphaChunk(const VP8Encoder* const enc) {
  const WebPPicture* const pic = enc->pic;
  uint8_t alpha_chunk_hdr[CHUNK_HEADER_SIZE] = {
    'A', 'L', 'P', 'H'
  };

  assert(enc->has_alpha);

  // Alpha chunk header.
  PutLE32(alpha_chunk_hdr + TAG_SIZE, enc->alpha_data_size);
  if (!pic->writer(alpha_chunk_hdr, sizeof(alpha_chunk_hdr), pic)) {
    return VP8_ENC_ERROR_BAD_WRITE;
  }

  // Alpha chunk data.
  if (!pic->writer(enc->alpha_data, enc->alpha_data_size, pic)) {
    return VP8_ENC_ERROR_BAD_WRITE;
  }

  // Padding.
  if ((enc->alpha_data_size & 1) && !PutPaddingByte(pic)) {
    return VP8_ENC_ERROR_BAD_WRITE;
  }
  return VP8_ENC_OK;
}